

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildFileGenerator::cmExportBuildFileGenerator(cmExportBuildFileGenerator *this)

{
  cmExportFileGenerator::cmExportFileGenerator(&this->super_cmExportFileGenerator);
  (this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator =
       (_func_int **)&PTR__cmExportBuildFileGenerator_0088c778;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->ExportSet = (cmExportSet *)0x0;
  (this->Exports).super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Exports).super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Exports).super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->LG = (cmLocalGenerator *)0x0;
  (this->CxxModulesDirectory)._M_dataplus._M_p = (pointer)&(this->CxxModulesDirectory).field_2;
  (this->CxxModulesDirectory)._M_string_length = 0;
  (this->CxxModulesDirectory).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmExportBuildFileGenerator::cmExportBuildFileGenerator()
{
  this->LG = nullptr;
  this->ExportSet = nullptr;
}